

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O3

int h262_macroblock(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm,h262_macroblock *mb,
                   uint32_t *qsc)

{
  uint32_t *val;
  int iVar1;
  uint uVar2;
  uint32_t ival;
  vs_vlc_val *tab;
  int iVar3;
  h262_seqparm *seqparm_00;
  ulong uVar4;
  int32_t (*block) [64];
  uint32_t mb_flags;
  uint local_44;
  h262_picparm *local_40;
  h262_seqparm *local_38;
  
  local_44 = mb->macroblock_intra << 4 |
             mb->macroblock_pattern << 3 | mb->macroblock_motion_backward << 2 |
             mb->macroblock_motion_forward * 2 | mb->macroblock_quant;
  switch(picparm->picture_coding_type) {
  case 1:
    tab = mbf_i_vlc;
    break;
  case 2:
    tab = mbf_p_vlc;
    break;
  case 3:
    tab = mbf_b_vlc;
    break;
  case 4:
    tab = mbf_d_vlc;
    break;
  default:
    h262_macroblock_cold_3();
    return 1;
  }
  iVar1 = vs_vlc(str,&local_44,tab);
  if (iVar1 != 0) {
    return 1;
  }
  if (str->dir == VS_DECODE) {
    mb->macroblock_skipped = 0;
    mb->macroblock_quant = local_44 & 1;
    uVar2 = local_44 >> 1 & 1;
    mb->macroblock_motion_forward = uVar2;
    mb->macroblock_motion_backward = local_44 >> 2 & 1;
    mb->macroblock_pattern = local_44 >> 3 & 1;
    mb->macroblock_intra = local_44 >> 4 & 1;
  }
  else {
    uVar2 = mb->macroblock_motion_forward;
  }
  if ((uVar2 == 0) && (mb->macroblock_motion_backward == 0)) {
    if (picparm->picture_structure == 3) {
      iVar1 = vs_infer(str,&mb->frame_motion_type,2);
    }
    else {
      iVar1 = vs_infer(str,&mb->field_motion_type,1);
    }
joined_r0x00104ea9:
    if (iVar1 != 0) {
      return 1;
    }
  }
  else {
    local_40 = picparm;
    if (picparm->picture_structure == 3) {
      val = &mb->frame_motion_type;
      if (picparm->frame_pred_frame_dct != 0) {
        iVar1 = vs_infer(str,val,2);
        picparm = local_40;
        goto joined_r0x00104ea9;
      }
      iVar1 = vs_u(str,val,2);
      if (iVar1 != 0) {
        return 1;
      }
      picparm = local_40;
      if (*val == 0) {
        h262_macroblock_cold_2();
        return 1;
      }
    }
    else {
      iVar1 = vs_u(str,&mb->field_motion_type,2);
      if (iVar1 != 0) {
        return 1;
      }
      picparm = local_40;
      if (mb->field_motion_type == 0) {
        h262_macroblock_cold_1();
        return 1;
      }
    }
  }
  if (((picparm->picture_structure == 3) && (picparm->frame_pred_frame_dct == 0)) &&
     ((mb->macroblock_intra != 0 || (mb->macroblock_pattern != 0)))) {
    iVar1 = vs_u(str,&mb->dct_type,1);
  }
  else {
    iVar1 = vs_infer(str,&mb->dct_type,0);
  }
  if (iVar1 != 0) {
    return 1;
  }
  seqparm_00 = (h262_seqparm *)&mb->quantiser_scale_code;
  if (mb->macroblock_quant == 0) {
    iVar1 = vs_infer(str,(uint32_t *)seqparm_00,*qsc);
  }
  else {
    iVar1 = vs_u(str,(uint32_t *)seqparm_00,5);
  }
  if (iVar1 != 0) {
    return 1;
  }
  *qsc = mb->quantiser_scale_code;
  if ((mb->macroblock_motion_forward == 0) &&
     ((mb->macroblock_intra == 0 || (picparm->concealment_motion_vectors == 0)))) {
    iVar1 = h262_infer_vectors(str,seqparm_00,picparm,mb,0);
  }
  else {
    iVar1 = h262_motion_vectors(str,seqparm_00,picparm,mb,0);
  }
  if (iVar1 != 0) {
    return 1;
  }
  if (mb->macroblock_motion_backward == 0) {
    iVar1 = h262_infer_vectors(str,seqparm_00,picparm,mb,1);
  }
  else {
    iVar1 = h262_motion_vectors(str,seqparm_00,picparm,mb,1);
  }
  if (iVar1 != 0) {
    return 1;
  }
  if (mb->macroblock_intra == 0) {
LAB_001050db:
    if (mb->macroblock_pattern != 0) {
      iVar1 = h262_coded_block_pattern(str,seqparm->chroma_format,&mb->coded_block_pattern);
      goto LAB_0010510c;
    }
    ival = 0;
  }
  else {
    if (picparm->concealment_motion_vectors != 0) {
      iVar1 = vs_mark(str,1,1);
      if (iVar1 != 0) {
        return 1;
      }
      if (mb->macroblock_intra == 0) goto LAB_001050db;
    }
    ival = ~(-1 << (*(byte *)(h262_macroblock::block_count + seqparm->chroma_format) & 0x1f));
  }
  iVar1 = vs_infer(str,&mb->coded_block_pattern,ival);
LAB_0010510c:
  iVar3 = 1;
  if (iVar1 == 0) {
    block = mb->block;
    uVar4 = 0;
    local_38 = seqparm;
    do {
      if (((mb->coded_block_pattern >> ((uint)uVar4 & 0x1f) & 1) != 0) &&
         (iVar1 = h262_block(str,seqparm,picparm,*block,mb->macroblock_intra,(uint)(3 < uVar4)),
         iVar1 != 0)) {
        return 1;
      }
      uVar4 = uVar4 + 1;
      block = block + 1;
    } while ((long)uVar4 < (long)h262_macroblock::block_count[seqparm->chroma_format]);
    if ((picparm->picture_coding_type == 4) && (iVar1 = vs_mark(str,1,1), iVar1 != 0)) {
      return 1;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int h262_macroblock(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_macroblock *mb, uint32_t *qsc) {
	uint32_t mb_flags = mb->macroblock_quant
		| mb->macroblock_motion_forward << 1
		| mb->macroblock_motion_backward << 2
		| mb->macroblock_pattern << 3
		| mb->macroblock_intra << 4;
	switch (picparm->picture_coding_type) {
		case H262_PIC_TYPE_I:
			if (vs_vlc(str, &mb_flags, mbf_i_vlc)) return 1;
			break;
		case H262_PIC_TYPE_P:
			if (vs_vlc(str, &mb_flags, mbf_p_vlc)) return 1;
			break;
		case H262_PIC_TYPE_B:
			if (vs_vlc(str, &mb_flags, mbf_b_vlc)) return 1;
			break;
		case H262_PIC_TYPE_D:
			if (vs_vlc(str, &mb_flags, mbf_d_vlc)) return 1;
			break;
		default:
			fprintf(stderr, "Invalid picture type\n");
			return 1;
	}
	if (str->dir == VS_DECODE) {
		mb->macroblock_skipped = 0;
		mb->macroblock_quant = mb_flags >> 0 & 1;
		mb->macroblock_motion_forward = mb_flags >> 1 & 1;
		mb->macroblock_motion_backward = mb_flags >> 2 & 1;
		mb->macroblock_pattern = mb_flags >> 3 & 1;
		mb->macroblock_intra = mb_flags >> 4 & 1;
	}
	if (mb->macroblock_motion_forward || mb->macroblock_motion_backward) {
		if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
			if (picparm->frame_pred_frame_dct) {
				if (vs_infer(str, &mb->frame_motion_type, H262_FRAME_MOTION_FRAME)) return 1;
			} else {
				if (vs_u(str, &mb->frame_motion_type, 2)) return 1;
				if (!mb->frame_motion_type) {
					fprintf(stderr, "Invalid frame_motion_type\n");
					return 1;
				}
			}
		} else {
			if (vs_u(str, &mb->field_motion_type, 2)) return 1;
			if (!mb->field_motion_type) {
				fprintf(stderr, "Invalid field_motion_type\n");
				return 1;
			}
		}
	} else {
		if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
			if (vs_infer(str, &mb->frame_motion_type, H262_FRAME_MOTION_FRAME)) return 1;
		} else {
			if (vs_infer(str, &mb->field_motion_type, H262_FIELD_MOTION_FIELD)) return 1;
		}
	}
	if (picparm->picture_structure == H262_PIC_STRUCT_FRAME && !picparm->frame_pred_frame_dct && (mb->macroblock_intra || mb->macroblock_pattern)) {
		if (vs_u(str, &mb->dct_type, 1)) return 1;
	} else {
		if (vs_infer(str, &mb->dct_type, 0)) return 1;
	}
	if (mb->macroblock_quant) {
		if (vs_u(str, &mb->quantiser_scale_code, 5)) return 1;
	} else {
		if (vs_infer(str, &mb->quantiser_scale_code, *qsc)) return 1;
	}
	*qsc = mb->quantiser_scale_code;
	if (mb->macroblock_motion_forward || (mb->macroblock_intra && picparm->concealment_motion_vectors)) {
		if (h262_motion_vectors(str, seqparm, picparm, mb, 0)) return 1;
	} else {
		if (h262_infer_vectors(str, seqparm, picparm, mb, 0)) return 1;
	}
	if (mb->macroblock_motion_backward) {
		if (h262_motion_vectors(str, seqparm, picparm, mb, 1)) return 1;
	} else {
		if (h262_infer_vectors(str, seqparm, picparm, mb, 1)) return 1;
	}
	if (mb->macroblock_intra && picparm->concealment_motion_vectors)
		if (vs_mark(str, 1, 1)) return 1;
	static const int block_count[4] = { 4, 6, 8, 12 };
	if (mb->macroblock_intra) {
		if (vs_infer(str, &mb->coded_block_pattern, (1 << block_count[seqparm->chroma_format]) - 1)) return 1;
	} else if (mb->macroblock_pattern) {
		if (h262_coded_block_pattern(str, seqparm->chroma_format, &mb->coded_block_pattern)) return 1;
	} else {
		if (vs_infer(str, &mb->coded_block_pattern, 0)) return 1;
	}
	int i;
	for (i = 0; i < block_count[seqparm->chroma_format]; i++)
		if (mb->coded_block_pattern & 1 << i) {
			if (h262_block(str, seqparm, picparm, mb->block[i], mb->macroblock_intra, i >= 4)) return 1;
		}
	if (picparm->picture_coding_type == H262_PIC_TYPE_D)
		if (vs_mark(str, 1, 1)) return 1;
	return 0;
}